

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

Curl_dns_entry * fetch_addr(Curl_easy *data,char *hostname,int port)

{
  uchar uVar1;
  Curl_addrinfo *pCVar2;
  size_t sVar3;
  Curl_dns_entry *pCVar4;
  time_t tVar5;
  curl_trc_feat *pcVar6;
  Curl_dns_entry *pCVar7;
  char *fmt;
  size_t in_R8;
  Curl_dns_entry *dns;
  char entry_id [262];
  
  sVar3 = create_hostcache_id(hostname,0,port,entry_id,in_R8);
  pCVar4 = (Curl_dns_entry *)Curl_hash_pick((data->dns).hostcache,entry_id,sVar3 + 1);
  if (pCVar4 == (Curl_dns_entry *)0x0) {
    if (((data->state).field_0x776 & 1) != 0) {
      sVar3 = create_hostcache_id("*",1,port,entry_id,in_R8);
      pCVar4 = (Curl_dns_entry *)Curl_hash_pick((data->dns).hostcache,entry_id,sVar3 + 1);
      if (pCVar4 != (Curl_dns_entry *)0x0) goto LAB_0012e0c2;
    }
LAB_0012e1cd:
    pCVar4 = (Curl_dns_entry *)0x0;
  }
  else {
LAB_0012e0c2:
    if ((data->set).dns_cache_timeout != -1) {
      tVar5 = time((time_t *)0x0);
      if ((pCVar4->timestamp != 0) &&
         ((long)(data->set).dns_cache_timeout <= tVar5 - pCVar4->timestamp)) {
        if (((data->set).field_0x8cd & 0x10) != 0) {
          pcVar6 = (data->state).feat;
          fmt = "Hostname in DNS cache was stale, zapped";
LAB_0012e1a3:
          if ((pcVar6 == (curl_trc_feat *)0x0) || (0 < pcVar6->log_level)) {
            Curl_infof(data,fmt);
          }
        }
LAB_0012e1b8:
        Curl_hash_delete((data->dns).hostcache,entry_id,sVar3 + 1);
        goto LAB_0012e1cd;
      }
    }
    uVar1 = data->conn->ip_version;
    if (uVar1 != '\0') {
      pCVar7 = pCVar4;
      do {
        pCVar2 = pCVar7->addr;
        if (pCVar2 == (Curl_addrinfo *)0x0) {
          if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0))
          goto LAB_0012e1b8;
          pcVar6 = (data->state).feat;
          fmt = "Hostname in DNS cache does not have needed family, zapped";
          goto LAB_0012e1a3;
        }
        pCVar7 = (Curl_dns_entry *)&pCVar2->ai_next;
      } while (pCVar2->ai_family != (uint)(uVar1 == '\x02') * 8 + 2);
    }
  }
  return pCVar4;
}

Assistant:

static struct Curl_dns_entry *fetch_addr(struct Curl_easy *data,
                                         const char *hostname,
                                         int port)
{
  struct Curl_dns_entry *dns = NULL;
  char entry_id[MAX_HOSTCACHE_LEN];

  /* Create an entry id, based upon the hostname and port */
  size_t entry_len = create_hostcache_id(hostname, 0, port,
                                         entry_id, sizeof(entry_id));

  /* See if it is already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

  /* No entry found in cache, check if we might have a wildcard entry */
  if(!dns && data->state.wildcard_resolve) {
    entry_len = create_hostcache_id("*", 1, port, entry_id, sizeof(entry_id));

    /* See if it is already in our dns cache */
    dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);
  }

  if(dns && (data->set.dns_cache_timeout != -1)) {
    /* See whether the returned entry is stale. Done before we release lock */
    struct hostcache_prune_data user;

    user.now = time(NULL);
    user.max_age_sec = data->set.dns_cache_timeout;
    user.oldest = 0;

    if(hostcache_entry_is_stale(&user, dns)) {
      infof(data, "Hostname in DNS cache was stale, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }

  /* See if the returned entry matches the required resolve mode */
  if(dns && data->conn->ip_version != CURL_IPRESOLVE_WHATEVER) {
    int pf = PF_INET;
    bool found = FALSE;
    struct Curl_addrinfo *addr = dns->addr;

#ifdef PF_INET6
    if(data->conn->ip_version == CURL_IPRESOLVE_V6)
      pf = PF_INET6;
#endif

    while(addr) {
      if(addr->ai_family == pf) {
        found = TRUE;
        break;
      }
      addr = addr->ai_next;
    }

    if(!found) {
      infof(data, "Hostname in DNS cache does not have needed family, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }
  return dns;
}